

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstspolicy.cpp
# Opt level: O0

void __thiscall QHstsPolicy::setIncludesSubDomains(QHstsPolicy *this,bool include)

{
  byte bVar1;
  QHstsPolicyPrivate *pQVar2;
  byte in_SIL;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = QSharedDataPointer<QHstsPolicyPrivate>::operator->
                     ((QSharedDataPointer<QHstsPolicyPrivate> *)
                      (CONCAT17(in_SIL,CONCAT16(in_SIL,in_stack_fffffffffffffff0)) &
                      0x101ffffffffffff));
  pQVar2->includeSubDomains = (bool)(bVar1 & 1);
  return;
}

Assistant:

void QHstsPolicy::setIncludesSubDomains(bool include)
{
    d->includeSubDomains = include;
}